

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjpeg.c
# Opt level: O2

opj_bool opj_decode_v2(opj_codec_t *p_info,opj_stream_t *cio,opj_image_t *p_image)

{
  opj_bool oVar1;
  
  if ((cio != (opj_stream_t *)0x0 && p_info != (opj_codec_t *)0x0) && (*(int *)(p_info + 0xc) != 0))
  {
    oVar1 = (*(code *)p_info[1])(p_info[10],cio,p_image,p_info[0xb],p_info[1]);
    return oVar1;
  }
  return 0;
}

Assistant:

opj_bool OPJ_CALLCONV opj_decode_v2(opj_codec_t *p_info,
									opj_stream_t *cio,
									opj_image_t* p_image)
{
	if (p_info && cio) {
		opj_codec_private_t * l_info = (opj_codec_private_t *) p_info;
		opj_stream_private_t * l_cio = (opj_stream_private_t *) cio;

		if (! l_info->is_decompressor) {
			return OPJ_FALSE;
		}

		return l_info->m_codec_data.m_decompression.opj_decode(	l_info->m_codec,
																l_cio,
																p_image,
																l_info->m_event_mgr);
	}

	return OPJ_FALSE;
}